

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O1

void CmdCommandPrint(Abc_Frame_t *pAbc,int fPrintAll,int fDetails)

{
  st__table *table;
  int iVar1;
  int iVar2;
  Abc_Command **ppC1;
  st__generator *gen;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *value;
  char *key;
  uint local_6c;
  Abc_Command *local_50;
  FILE *local_48;
  ulong local_40;
  char *local_38;
  
  table = pAbc->tCommands;
  local_48 = pAbc->Err;
  ppC1 = (Abc_Command **)malloc((long)table->num_entries << 3);
  gen = st__init_gen(table);
  iVar1 = st__gen(gen,&local_38,(char **)&local_50);
  uVar7 = 0;
  if (iVar1 != 0) {
    do {
      if ((fPrintAll != 0) || (*local_50->sName != '_')) {
        lVar5 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        ppC1[lVar5] = local_50;
      }
      iVar1 = st__gen(gen,&local_38,(char **)&local_50);
    } while (iVar1 != 0);
  }
  st__free_gen(gen);
  qsort(ppC1,(long)(int)uVar7,8,CmdCommandPrintCompare);
  iVar1 = CmdCommandPrintCompare(ppC1,ppC1 + ((long)(int)uVar7 - 1));
  if (iVar1 < 1) {
    local_6c = 0;
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar6 = 0;
      uVar9 = 0;
      do {
        sVar3 = strlen(ppC1[uVar6]->sName);
        uVar10 = sVar3 & 0xffffffff;
        if ((int)sVar3 < (int)uVar9) {
          uVar10 = uVar9;
        }
        uVar9 = uVar10;
        uVar6 = uVar6 + 1;
        uVar11 = (uint)uVar9;
      } while (uVar7 != uVar6);
    }
    local_40 = (ulong)uVar7;
    fprintf((FILE *)pAbc->Out,"      Welcome to ABC compiled on %s %s!","May  2 2025","18:31:17");
    pAbc->Err = pAbc->Out;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = 0;
      iVar1 = 0;
      pcVar8 = (char *)0x0;
      local_6c = 0;
      do {
        if ((pcVar8 == (char *)0x0) || (iVar2 = strcmp(pcVar8,ppC1[uVar6]->sGroup), iVar2 != 0)) {
          if ((fDetails != 0) && (uVar6 != local_6c)) {
            fputc(10,(FILE *)pAbc->Out);
            uVar9 = (ulong)(int)local_6c;
            if ((long)uVar9 < (long)uVar6) {
              do {
                uVar10 = uVar9 + 1;
                fputc(10,(FILE *)pAbc->Out);
                pcVar8 = ppC1[uVar9]->sName;
                sVar3 = strlen(pcVar8);
                pcVar4 = (char *)malloc(sVar3 + 4);
                sprintf(pcVar4,"%s -h",pcVar8);
                Cmd_CommandExecute(pAbc,pcVar4);
                if (pcVar4 != (char *)0x0) {
                  free(pcVar4);
                }
                uVar9 = uVar10;
              } while ((uVar10 & 0xffffffff) != uVar6);
            }
            fputc(10,(FILE *)pAbc->Out);
            fwrite("   ----------------------------------------------------------------------",0x49,
                   1,(FILE *)pAbc->Out);
            local_6c = (uint)uVar6;
          }
          fputc(10,(FILE *)pAbc->Out);
          fputc(10,(FILE *)pAbc->Out);
          fprintf((FILE *)pAbc->Out,"%s commands:\n",ppC1[uVar6]->sGroup);
          fprintf((FILE *)pAbc->Out," %-*s",(ulong)uVar11,ppC1[uVar6]->sName);
          pcVar8 = ppC1[uVar6]->sGroup;
          iVar1 = 1;
        }
        else {
          if (iVar1 % (int)(0x4f / (ulong)(uVar11 + 2)) == 0) {
            fputc(10,(FILE *)pAbc->Out);
          }
          iVar1 = iVar1 + 1;
          fprintf((FILE *)pAbc->Out," %-*s",(ulong)uVar11,ppC1[uVar6]->sName);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != local_40);
    }
    uVar7 = (uint)uVar6;
    if (uVar7 != local_6c && fDetails != 0) {
      fputc(10,(FILE *)pAbc->Out);
      if ((int)local_6c < (int)uVar7) {
        lVar5 = 0;
        do {
          fputc(10,(FILE *)pAbc->Out);
          pcVar8 = ppC1[(int)local_6c + lVar5]->sName;
          sVar3 = strlen(pcVar8);
          pcVar4 = (char *)malloc(sVar3 + 4);
          sprintf(pcVar4,"%s -h",pcVar8);
          Cmd_CommandExecute(pAbc,pcVar4);
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          lVar5 = lVar5 + 1;
        } while (uVar7 - local_6c != (int)lVar5);
      }
    }
    pAbc->Err = local_48;
    fputc(10,(FILE *)pAbc->Out);
    if (ppC1 != (Abc_Command **)0x0) {
      free(ppC1);
    }
    return;
  }
  __assert_fail("CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cmd/cmdUtils.c"
                ,0x245,"void CmdCommandPrint(Abc_Frame_t *, int, int)");
}

Assistant:

void CmdCommandPrint( Abc_Frame_t * pAbc, int fPrintAll, int fDetails )
{
    const char *key;
    char *value;
    st__generator * gen;
    Abc_Command ** ppCommands;
    Abc_Command * pCommands;
    int nCommands, iGroupStart, i, j;
    char * sGroupCur;
    int LenghtMax, nColumns, iCom = 0;
    FILE *backupErr = pAbc->Err;

    // put all commands into one array
    nCommands = st__count( pAbc->tCommands );
    ppCommands = ABC_ALLOC( Abc_Command *, nCommands );
    i = 0;
    st__foreach_item( pAbc->tCommands, gen, &key, &value )
    {
        pCommands = (Abc_Command *)value;
        if ( fPrintAll || pCommands->sName[0] != '_' )
            ppCommands[i++] = pCommands;
    }
    nCommands = i;

    // sort command by group and then by name, alphabetically
    qsort( (void *)ppCommands, (size_t)nCommands, sizeof(Abc_Command *), 
            (int (*)(const void *, const void *)) CmdCommandPrintCompare );
    assert( CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0 );

    // get the longest command name
    LenghtMax = 0;
    for ( i = 0; i < nCommands; i++ )
        if ( LenghtMax < (int)strlen(ppCommands[i]->sName) )
             LenghtMax = (int)strlen(ppCommands[i]->sName); 
    // get the number of columns
    nColumns = 79 / (LenghtMax + 2);

    // print the starting message 
    fprintf( pAbc->Out, "      Welcome to ABC compiled on %s %s!", __DATE__, __TIME__ );

    // print the command by group
    sGroupCur = NULL;
    iGroupStart = 0;
    pAbc->Err = pAbc->Out;
    for ( i = 0; i < nCommands; i++ )
        if ( sGroupCur && strcmp( sGroupCur, ppCommands[i]->sGroup ) == 0 )
        { // this command belongs to the same group as the previous one
            if ( iCom++ % nColumns == 0 )
                fprintf( pAbc->Out, "\n" ); 
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
        }
        else
        { // this command starts the new group of commands
            // start the new group
            if ( fDetails && i != iGroupStart )
            { // print help messages for all commands in the previous groups
                fprintf( pAbc->Out, "\n" );
                for ( j = iGroupStart; j < i; j++ )
                {
                    char *tmp_cmd;
                    fprintf( pAbc->Out, "\n" );
                    // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
                    tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
                    (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
                    (void) Cmd_CommandExecute( pAbc, tmp_cmd );
                    ABC_FREE(tmp_cmd);
                }
                fprintf( pAbc->Out, "\n" );
                fprintf( pAbc->Out, "   ----------------------------------------------------------------------" );
                iGroupStart = i;
            }
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "%s commands:\n", ppCommands[i]->sGroup );
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
            // remember current command group
            sGroupCur = ppCommands[i]->sGroup;
            // reset the command counter
            iCom = 1;
        }
    if ( fDetails && i != iGroupStart )
    { // print help messages for all commands in the previous groups
        fprintf( pAbc->Out, "\n" );
        for ( j = iGroupStart; j < i; j++ )
        {
            char *tmp_cmd;
            fprintf( pAbc->Out, "\n" );
            // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
            tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
            (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
            (void) Cmd_CommandExecute( pAbc, tmp_cmd );
            ABC_FREE(tmp_cmd);
        }
    }
    pAbc->Err = backupErr;
    fprintf( pAbc->Out, "\n" );
    ABC_FREE( ppCommands );
}